

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
     texture_storage_multisample_2d_array(NegativeTestContext *ctx)

{
  NegativeTestContext *ctx_00;
  ostream *poVar1;
  string local_1e0;
  ostringstream local_1c0 [8];
  ostringstream source;
  int ndx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_OES_texture_storage_multisample_2d_array features require enabling the extension in 310 es shaders."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (source._368_4_ = 0; (int)source._368_4_ < 3; source._368_4_ = source._368_4_ + 1) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar1 = std::operator<<((ostream *)local_1c0,"#version 310 es\n\t");
    poVar1 = std::operator<<(poVar1,texture_storage_multisample_2d_array::s_samplerTypeTests
                                    [(int)source._368_4_]);
    std::operator<<(poVar1,"\nprecision mediump float;\nvoid main()\n{\n}\n");
    ctx_00 = local_10;
    std::__cxx11::ostringstream::str();
    verifyShader(ctx_00,SHADERTYPE_FRAGMENT,&local_1e0,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void texture_storage_multisample_2d_array (NegativeTestContext& ctx)
{
	static const char* const s_samplerTypeTests[] =
	{
		"uniform mediump sampler2DMSArray u_sampler;",
		"uniform mediump isampler2DMSArray u_sampler;",
		"uniform mediump usampler2DMSArray u_sampler;",
	};

	ctx.beginSection("GL_OES_texture_storage_multisample_2d_array features require enabling the extension in 310 es shaders.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_samplerTypeTests); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"	" << s_samplerTypeTests[ndx] << "\n"
					"precision mediump float;\n"
					"void main()\n"
					"{\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
}